

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

string * cmQtAutoGenInitializer::InfoWriter::ConfigKey
                   (string *__return_storage_ptr__,char *key,string *config)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,key,&local_11)
  ;
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::InfoWriter::ConfigKey(
  const char* key, std::string const& config)
{
  std::string ckey = key;
  ckey += '_';
  ckey += config;
  return ckey;
}